

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::AllocDecommitPages<BVStatic<272ul>,false>
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,uint pageCount,
          BVStatic<272UL> freePages,BVStatic<272UL> decommitPages)

{
  PageBitVector *this_00;
  ulong *puVar1;
  uint uVar2;
  SecondaryAllocator *pSVar3;
  PageAllocatorBaseCommon *pPVar4;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BVIndex BVar8;
  int iVar9;
  BVIndex BVar10;
  uint uVar11;
  undefined4 *puVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  AllocatorType *pAVar16;
  char cVar17;
  BVIndex BVar18;
  PageBitVector *this_01;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_02;
  char *unaff_R13;
  ulong uVar19;
  char *lpAddress;
  undefined1 auStack_a8 [8];
  BVStatic<272UL> freeAndDecommitPages;
  
  BVar10 = this->freePageCount;
  this_01 = &this->freePages;
  BVar8 = BVStatic<272UL>::Count(this_01);
  if (BVar10 != BVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x192,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar6) goto LAB_00710421;
    *puVar12 = 0;
  }
  BVar10 = this->decommitPageCount;
  this_00 = &this->decommitPages;
  BVar8 = BVStatic<272UL>::Count(this_00);
  if (BVar10 != BVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x193,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                       "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
    if (!bVar6) goto LAB_00710421;
    *puVar12 = 0;
  }
  if (this->decommitPageCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x194,"(decommitPageCount != 0)","decommitPageCount != 0");
    if (!bVar6) goto LAB_00710421;
    *puVar12 = 0;
  }
  if (pageCount <= this->decommitPageCount + this->freePageCount) {
    pSVar3 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).secondaryAllocator;
    if ((pSVar3 != (SecondaryAllocator *)0x0) &&
       (iVar9 = (*pSVar3->_vptr_SecondaryAllocator[3])(), (char)iVar9 == '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x199,
                         "(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate())"
                         ,
                         "this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate()"
                        );
      if (!bVar6) {
LAB_00710421:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar12 = 0;
    }
    freeAndDecommitPages.data[3] = freePages.data[4];
    freeAndDecommitPages.data[1] = freePages.data[2];
    freeAndDecommitPages.data[2] = freePages.data[3];
    auStack_a8 = (undefined1  [8])freePages.data[0].word;
    freeAndDecommitPages.data[0] = freePages.data[1];
    lVar15 = 0;
    do {
      puVar1 = (ulong *)((long)(freeAndDecommitPages.data + -1) + lVar15);
      *puVar1 = *puVar1 | *(ulong *)((long)&decommitPages.data[0].word + lVar15);
      lVar15 = lVar15 + 8;
    } while (lVar15 != 0x28);
    uVar2 = this->freePageCount;
    BVar10 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_a8,0);
    if (BVar10 == 0xffffffff) {
      return (char *)0x0;
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar13 = (ulong)pageCount * 0x1000;
    do {
      pPVar4 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
               allocator;
      pAVar16 = &pPVar4[-1].allocatorType;
      if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
        pAVar16 = (AllocatorType *)0x0;
      }
      if (pAVar16[0x28] <= BVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x1a3,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar6) goto LAB_00710421;
        *puVar12 = 0;
      }
      uVar11 = GetAvailablePageCount(this);
      if (uVar11 - BVar10 < pageCount) {
        return (char *)0x0;
      }
      if ((pageCount == 1) ||
         (BVar7 = BVStatic<272UL>::TestRange((BVStatic<272UL> *)auStack_a8,BVar10,pageCount),
         BVar7 != '\0')) {
        lpAddress = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address + (BVar10 << 0xc)
        ;
        cVar17 = '\0';
        uVar19 = uVar13 - 1 & (ulong)lpAddress;
        if (uVar19 != 0) {
          BVar8 = (int)((ulong)lpAddress % uVar13 >> 0xc) + BVar10;
          pPVar4 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                   allocator;
          pAVar16 = &pPVar4[-1].allocatorType;
          if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
            pAVar16 = (AllocatorType *)0x0;
          }
          if (BVar8 < pAVar16[0x28]) {
            BVar10 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_a8,BVar8);
            cVar17 = '\n';
          }
          else {
            cVar17 = '\x01';
            unaff_R13 = (char *)0x0;
          }
        }
        if (uVar19 == 0) {
          pPVar4 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                   allocator;
          this_02 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                     *)&pPVar4[-1].allocatorType;
          if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
            this_02 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       *)0x0;
          }
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::GetVirtualAllocator(this_02);
          pPVar4 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                   allocator;
          pAVar16 = &pPVar4[-1].allocatorType;
          if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
            pAVar16 = (AllocatorType *)0x0;
          }
          pcVar14 = (char *)VirtualAllocWrapper::AllocPages
                                      ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,
                                       lpAddress,(ulong)pageCount,0x1000,4,pAVar16[0x50] == 2);
          if (pcVar14 == (char *)0x0) {
            cVar17 = pageCount == 1;
            if (pageCount == 1) {
              unaff_R13 = (char *)0x0;
            }
          }
          else {
            if (pcVar14 != lpAddress) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x1be,"(ret == pages)","ret == pages");
              if (!bVar6) goto LAB_00710421;
              *puVar12 = 0;
            }
            BVStatic<272UL>::ClearRange(this_01,BVar10,pageCount);
            BVStatic<272UL>::ClearRange(this_00,BVar10,pageCount);
            BVar8 = BVStatic<272UL>::Count(this_01);
            BVar18 = (this->freePageCount - uVar2) + BVar8;
            this->freePageCount = BVar18;
            this->decommitPageCount = this->decommitPageCount + (uVar2 - (BVar8 + pageCount));
            BVar8 = BVStatic<272UL>::Count(this_01);
            if (BVar18 != BVar8) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x1c7,"(freePageCount == (uint)this->GetCountOfFreePages())",
                                 "freePageCount == (uint)this->GetCountOfFreePages()");
              if (!bVar6) goto LAB_00710421;
              *puVar12 = 0;
            }
            BVar8 = this->decommitPageCount;
            BVar18 = BVStatic<272UL>::Count(this_00);
            cVar17 = '\x01';
            unaff_R13 = lpAddress;
            if (BVar8 != BVar18) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x1c8,
                                 "(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                                 "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
              if (!bVar6) goto LAB_00710421;
              *puVar12 = 0;
            }
          }
        }
        if (cVar17 == '\0') goto LAB_007103e2;
        if (cVar17 != '\n') {
          return unaff_R13;
        }
      }
      else {
LAB_007103e2:
        BVar10 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_a8,BVar10 + 1);
      }
    } while (BVar10 != 0xffffffff);
  }
  return (char *)0x0;
}

Assistant:

char *
PageSegmentBase<TVirtualAlloc>::AllocDecommitPages(uint pageCount, T freePages, T decommitPages)
{
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    Assert(decommitPageCount ==  (uint)this->GetCountOfDecommitPages());
    Assert(decommitPageCount != 0);
    if (freePageCount + decommitPageCount < pageCount)
    {
        return nullptr;
    }
    Assert(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate());

    T freeAndDecommitPages = freePages;

    freeAndDecommitPages.Or(&decommitPages);

    uint oldFreePageCount = freePageCount;
    uint index = freeAndDecommitPages.GetNextBit(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || freeAndDecommitPages.TestRange(index, pageCount))
        {
            char * pages = this->address + index * AutoSystemInfo::PageSize;

            if (!notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(pages, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = freeAndDecommitPages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            void * ret = this->GetAllocator()->GetVirtualAllocator()->AllocPages(pages, pageCount, MEM_COMMIT, PAGE_READWRITE, this->IsInCustomHeapAllocator());
            if (ret != nullptr)
            {
                Assert(ret == pages);

                this->ClearRangeInFreePagesBitVector(index, pageCount);
                this->ClearRangeInDecommitPagesBitVector(index, pageCount);

                uint newFreePageCount = this->GetCountOfFreePages();
                freePageCount = freePageCount - oldFreePageCount + newFreePageCount;
                decommitPageCount -= pageCount - (oldFreePageCount - newFreePageCount);

                Assert(freePageCount == (uint)this->GetCountOfFreePages());
                Assert(decommitPageCount == (uint)this->GetCountOfDecommitPages());

                return pages;
            }
            else if (pageCount == 1)
            {
                // if we failed to commit one page, we should just give up.
                return nullptr;
            }
        }
        index = freeAndDecommitPages.GetNextBit(index + 1);
    }

    return nullptr;
}